

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

int32_t upb_test_TestExtensions_optional_int32_ext(upb_test_TestExtensions *msg)

{
  int32_t ret;
  int32_t default_val;
  int32_t local_10 [2];
  
  if ((upb_test_TestExtensions_optional_int32_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                  ,0xcec,
                  "int32_t upb_test_TestExtensions_optional_int32_ext(const struct upb_test_TestExtensions *)"
                 );
  }
  if ((upb_test_TestExtensions_optional_int32_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 0xc0) == 0x40) {
    local_10[1] = 0;
    _upb_Message_GetExtensionField
              (&msg->base_dont_copy_me__upb_internal_use_only,
               &upb_test_TestExtensions_optional_int32_ext_ext,local_10 + 1,local_10);
    return local_10[0];
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                ,0xcee,
                "int32_t upb_test_TestExtensions_optional_int32_ext(const struct upb_test_TestExtensions *)"
               );
}

Assistant:

UPB_INLINE int32_t upb_test_TestExtensions_optional_int32_ext(const struct upb_test_TestExtensions* msg) {
  const upb_MiniTableExtension* ext = &upb_test_TestExtensions_optional_int32_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == kUpb_FieldRep_4Byte);
  int32_t default_val = (int32_t)0;
  int32_t ret;
  _upb_Message_GetExtensionField((upb_Message*)msg, ext, &default_val, &ret);
  return ret;
}